

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

void __thiscall ON_Sun::LoadFromXMLNode(ON_Sun *this,ON_XMLNode *node)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  ON_XMLVariant local_2348;
  ON_XMLVariant local_2250;
  ON_XMLVariant local_2158;
  ON_XMLVariant local_2060;
  ON_XMLVariant local_1f68;
  ON_XMLVariant local_1e70;
  ON_XMLVariant local_1d78;
  ON_XMLVariant local_1c80;
  ON_XMLVariant local_1b88;
  ON_XMLVariant local_1a90;
  ON_XMLVariant local_1998;
  ON_XMLVariant local_18a0;
  ON_XMLVariant local_17a8;
  ON_XMLVariant local_16b0;
  ON_XMLVariant local_15b8;
  ON_XMLVariant local_14c0;
  ON_XMLVariant local_13c8;
  ON_XMLVariant local_12d0;
  ON_XMLVariant local_11d8;
  ON_XMLVariant local_10e0;
  ON_XMLVariant local_fe8;
  ON_XMLVariant local_ef0;
  ON_XMLVariant local_df8;
  ON_XMLVariant local_d00;
  ON_XMLVariant local_c08;
  ON_XMLVariant local_b10;
  ON_XMLVariant local_a18;
  ON_XMLVariant local_920;
  ON_XMLVariant local_828;
  ON_XMLVariant local_730;
  double local_638;
  double h;
  ON_XMLVariant local_538;
  uint local_43c;
  undefined1 local_438 [4];
  int d;
  ON_XMLVariant local_340;
  uint local_244;
  undefined1 local_240 [4];
  int m;
  ON_XMLVariant local_148;
  uint local_50;
  int y;
  double local_40;
  double dh;
  int local_30;
  int dd;
  int dm;
  int dy;
  ON_XMLParameters p;
  ON_XMLNode *node_local;
  ON_Sun *this_local;
  
  p._private = (ON_XMLParametersPrivate *)node;
  ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)&dm,node);
  dd = 0;
  local_30 = 0;
  dh._4_4_ = 0;
  local_40 = 0.0;
  ON_SunEngine::GetDefaultLocalDateTime(&dd,&local_30,(int *)((long)&dh + 4),&local_40);
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)local_240,dd);
  ON_XMLParameters::GetParam(&local_148,(ON_XMLParameters *)&dm,L"year",(ON_XMLVariant *)local_240);
  uVar2 = ::ON_XMLVariant::AsInteger(&local_148);
  ::ON_XMLVariant::~ON_XMLVariant(&local_148);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_240);
  local_50 = uVar2;
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)local_438,local_30);
  ON_XMLParameters::GetParam(&local_340,(ON_XMLParameters *)&dm,L"month",(ON_XMLVariant *)local_438)
  ;
  uVar2 = ::ON_XMLVariant::AsInteger(&local_340);
  ::ON_XMLVariant::~ON_XMLVariant(&local_340);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_438);
  local_244 = uVar2;
  ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&h,dh._4_4_);
  ON_XMLParameters::GetParam(&local_538,(ON_XMLParameters *)&dm,L"day",(ON_XMLVariant *)&h);
  uVar2 = ::ON_XMLVariant::AsInteger(&local_538);
  ::ON_XMLVariant::~ON_XMLVariant(&local_538);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&h);
  local_43c = uVar2;
  ::ON_XMLVariant::ON_XMLVariant(&local_828,local_40);
  ON_XMLParameters::GetParam(&local_730,(ON_XMLParameters *)&dm,L"time",&local_828);
  dVar3 = ::ON_XMLVariant::AsDouble(&local_730);
  ::ON_XMLVariant::~ON_XMLVariant(&local_730);
  ::ON_XMLVariant::~ON_XMLVariant(&local_828);
  local_638 = dVar3;
  (*this->_vptr_ON_Sun[0x20])(dVar3,this,(ulong)local_50,(ulong)local_244,(ulong)local_43c);
  ::ON_XMLVariant::ON_XMLVariant(&local_a18,false);
  ON_XMLParameters::GetParam(&local_920,(ON_XMLParameters *)&dm,L"enable-allowed",&local_a18);
  ::ON_XMLVariant::operator_cast_to_bool(&local_920);
  (*this->_vptr_ON_Sun[0x14])();
  ::ON_XMLVariant::~ON_XMLVariant(&local_920);
  ::ON_XMLVariant::~ON_XMLVariant(&local_a18);
  ::ON_XMLVariant::ON_XMLVariant(&local_c08,false);
  ON_XMLParameters::GetParam(&local_b10,(ON_XMLParameters *)&dm,L"enable-on",&local_c08);
  ::ON_XMLVariant::operator_cast_to_bool(&local_b10);
  (*this->_vptr_ON_Sun[0x15])();
  ::ON_XMLVariant::~ON_XMLVariant(&local_b10);
  ::ON_XMLVariant::~ON_XMLVariant(&local_c08);
  ::ON_XMLVariant::ON_XMLVariant(&local_df8,false);
  ON_XMLParameters::GetParam
            (&local_d00,(ON_XMLParameters *)&dm,L"manual-control-allowed",&local_df8);
  ::ON_XMLVariant::operator_cast_to_bool(&local_d00);
  (*this->_vptr_ON_Sun[0x16])();
  ::ON_XMLVariant::~ON_XMLVariant(&local_d00);
  ::ON_XMLVariant::~ON_XMLVariant(&local_df8);
  ::ON_XMLVariant::ON_XMLVariant(&local_fe8,false);
  ON_XMLParameters::GetParam(&local_ef0,(ON_XMLParameters *)&dm,L"manual-control-on",&local_fe8);
  bVar1 = ::ON_XMLVariant::operator_cast_to_bool(&local_ef0);
  (*this->_vptr_ON_Sun[0x17])(this,(ulong)bVar1);
  ::ON_XMLVariant::~ON_XMLVariant(&local_ef0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_fe8);
  ::ON_XMLVariant::ON_XMLVariant(&local_11d8,90.0);
  ON_XMLParameters::GetParam(&local_10e0,(ON_XMLParameters *)&dm,L"north",&local_11d8);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_10e0);
  (*this->_vptr_ON_Sun[0x18])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_10e0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_11d8);
  ::ON_XMLVariant::ON_XMLVariant(&local_13c8,0.0);
  ON_XMLParameters::GetParam(&local_12d0,(ON_XMLParameters *)&dm,L"sun-azimuth",&local_13c8);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_12d0);
  (*this->_vptr_ON_Sun[0x19])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_12d0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_13c8);
  ::ON_XMLVariant::ON_XMLVariant(&local_15b8,0.0);
  ON_XMLParameters::GetParam(&local_14c0,(ON_XMLParameters *)&dm,L"sun-altitude",&local_15b8);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_14c0);
  (*this->_vptr_ON_Sun[0x1a])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_14c0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_15b8);
  ::ON_XMLVariant::ON_XMLVariant(&local_17a8,false);
  ON_XMLParameters::GetParam(&local_16b0,(ON_XMLParameters *)&dm,L"daylight-saving-on",&local_17a8);
  ::ON_XMLVariant::operator_cast_to_bool(&local_16b0);
  (*this->_vptr_ON_Sun[0x1e])();
  ::ON_XMLVariant::~ON_XMLVariant(&local_16b0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_17a8);
  ::ON_XMLVariant::ON_XMLVariant(&local_1998,0);
  ON_XMLParameters::GetParam
            (&local_18a0,(ON_XMLParameters *)&dm,L"daylight-saving-minutes",&local_1998);
  uVar2 = ::ON_XMLVariant::operator_cast_to_int(&local_18a0);
  (*this->_vptr_ON_Sun[0x1f])(this,(ulong)uVar2);
  ::ON_XMLVariant::~ON_XMLVariant(&local_18a0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1998);
  ::ON_XMLVariant::ON_XMLVariant(&local_1b88,0.0);
  ON_XMLParameters::GetParam(&local_1a90,(ON_XMLParameters *)&dm,L"observer-latitude",&local_1b88);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_1a90);
  (*this->_vptr_ON_Sun[0x1b])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1a90);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1b88);
  ::ON_XMLVariant::ON_XMLVariant(&local_1d78,0.0);
  ON_XMLParameters::GetParam(&local_1c80,(ON_XMLParameters *)&dm,L"observer-longitude",&local_1d78);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_1c80);
  (*this->_vptr_ON_Sun[0x1c])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1c80);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1d78);
  ::ON_XMLVariant::ON_XMLVariant(&local_1f68,0);
  ON_XMLParameters::GetParam(&local_1e70,(ON_XMLParameters *)&dm,L"observer-timezone",&local_1f68);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_1e70);
  (*this->_vptr_ON_Sun[0x1d])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1e70);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1f68);
  ::ON_XMLVariant::ON_XMLVariant(&local_2158,1.0);
  ON_XMLParameters::GetParam(&local_2060,(ON_XMLParameters *)&dm,L"shadow-intensity",&local_2158);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_2060);
  (*this->_vptr_ON_Sun[0x21])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_2060);
  ::ON_XMLVariant::~ON_XMLVariant(&local_2158);
  ::ON_XMLVariant::ON_XMLVariant(&local_2348,1.0);
  ON_XMLParameters::GetParam(&local_2250,(ON_XMLParameters *)&dm,L"intensity",&local_2348);
  dVar3 = ::ON_XMLVariant::operator_cast_to_double(&local_2250);
  (*this->_vptr_ON_Sun[0x22])(dVar3);
  ::ON_XMLVariant::~ON_XMLVariant(&local_2250);
  ::ON_XMLVariant::~ON_XMLVariant(&local_2348);
  ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)&dm);
  return;
}

Assistant:

void ON_Sun::LoadFromXMLNode(const ON_XMLNode& node)
{
  ON_XMLParameters p(node);

  int dy = 0, dm = 0, dd = 0; double dh = 0.0;
  ON_SunEngine::GetDefaultLocalDateTime(dy, dm, dd, dh);

  const auto y = p.GetParam(ON_RDK_SUN_DATE_YEAR,  dy).AsInteger();
  const auto m = p.GetParam(ON_RDK_SUN_DATE_MONTH, dm).AsInteger();
  const auto d = p.GetParam(ON_RDK_SUN_DATE_DAY,   dd).AsInteger();
  const auto h = p.GetParam(ON_RDK_SUN_TIME_HOURS, dh).AsDouble();
  SetLocalDateTime(y, m, d, h);

  SetEnableAllowed        (p.GetParam(ON_RDK_SUN_ENABLE_ALLOWED, false));
  SetEnableOn             (p.GetParam(ON_RDK_SUN_ENABLE_ON, false));
  SetManualControlAllowed (p.GetParam(ON_RDK_SUN_MANUAL_CONTROL_ALLOWED, false));
  SetManualControlOn      (p.GetParam(ON_RDK_SUN_MANUAL_CONTROL_ON, false));
  SetNorth                (p.GetParam(ON_RDK_SUN_NORTH, 90.0));
  SetAzimuth              (p.GetParam(ON_RDK_SUN_AZIMUTH, 0.0));
  SetAltitude             (p.GetParam(ON_RDK_SUN_ALTITUDE, 0.0));
  SetDaylightSavingOn     (p.GetParam(ON_RDK_SUN_DAYLIGHT_SAVING_ON, false));
  SetDaylightSavingMinutes(p.GetParam(ON_RDK_SUN_DAYLIGHT_SAVING_MINUTES, 0));
  SetLatitude             (p.GetParam(ON_RDK_SUN_OBSERVER_LATITUDE, 0.0));
  SetLongitude            (p.GetParam(ON_RDK_SUN_OBSERVER_LONGITUDE, 0.0));
  SetTimeZone             (p.GetParam(ON_RDK_SUN_OBSERVER_TIMEZONE, 0));
  SetShadowIntensity      (p.GetParam(ON_RDK_SUN_SHADOW_INTENSITY, 1.0));
  SetIntensity            (p.GetParam(ON_RDK_SUN_INTENSITY, 1.0));
}